

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O2

TPM_HANDLE
TSS_CreatePersistentKey
          (TSS_DEVICE *tpm_device,TPM_HANDLE request_handle,TSS_SESSION *sess,
          TPMI_DH_OBJECT hierarchy,TPM2B_PUBLIC *inPub,TPM2B_PUBLIC *outPub)

{
  TPM_RC TVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  TPM_HANDLE result;
  TPM2B_NAME qName;
  TPM2B_NAME name;
  
  TVar1 = TPM2_ReadPublic(tpm_device,request_handle,outPub,&name,&qName);
  if (TVar1 == 0) {
    return request_handle;
  }
  if (TVar1 == 0x8b) {
    TVar1 = TSS_CreatePrimary(tpm_device,sess,hierarchy,inPub,&result,outPub);
    if (TVar1 == 0) {
      TVar1 = TPM2_EvictControl(tpm_device,sess,0x40000001,result,request_handle);
      if (TVar1 == 0) {
        TVar1 = TPM2_FlushContext(tpm_device,result);
        if (TVar1 == 0) {
          return request_handle;
        }
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 == (LOGGER_LOG)0x0) {
          return 0;
        }
        pcVar4 = "Failed calling TPM2_FlushContext 0x%x";
        iVar3 = 0xea;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 == (LOGGER_LOG)0x0) {
          return 0;
        }
        pcVar4 = "Failed calling TPM2_EvictControl 0x%x";
        iVar3 = 0xe5;
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return 0;
      }
      pcVar4 = "Failed calling TSS_CreatePrimary 0x%x";
      iVar3 = 0xde;
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0;
    }
    pcVar4 = "Failed calling TPM2_ReadPublic 0x%x";
    iVar3 = 0xd7;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_codec.c"
            ,"TSS_CreatePersistentKey",iVar3,1,pcVar4,TVar1);
  return 0;
}

Assistant:

TPM_HANDLE TSS_CreatePersistentKey(TSS_DEVICE* tpm_device, TPM_HANDLE request_handle, TSS_SESSION* sess, TPMI_DH_OBJECT hierarchy, TPM2B_PUBLIC* inPub, TPM2B_PUBLIC* outPub)
{
    TPM_HANDLE result;
    TPM_RC tpm_result;
    TPM2B_NAME name;
    TPM2B_NAME qName;

    tpm_result = TPM2_ReadPublic(tpm_device, request_handle, outPub, &name, &qName);
    if (tpm_result == TPM_RC_SUCCESS)
    {
        result = request_handle;
    }
    else if (tpm_result != TPM_RC_HANDLE)
    {
        LogError("Failed calling TPM2_ReadPublic 0x%x", tpm_result);
        result = 0;
    }
    else
    {
        if ((tpm_result = TSS_CreatePrimary(tpm_device, sess, hierarchy, inPub, &result, outPub)) != TPM_RC_SUCCESS)
        {
            LogError("Failed calling TSS_CreatePrimary 0x%x", tpm_result);
            result = 0;
        }
        else
        {
            if ((tpm_result = TPM2_EvictControl(tpm_device, sess, TPM_RH_OWNER, result, request_handle)) != TPM_RC_SUCCESS)
            {
                LogError("Failed calling TPM2_EvictControl 0x%x", tpm_result);
                result = 0;
            }
            else if ((tpm_result = TPM2_FlushContext(tpm_device, result)) != TPM_RC_SUCCESS)
            {
                LogError("Failed calling TPM2_FlushContext 0x%x", tpm_result);
                result = 0;
            }
            else
            {
                result = request_handle;
            }
        }
    }
    return result;
}